

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O3

long __thiscall
gl4cts::anon_unknown_0::AdvancedWriteTessellation::Run(AdvancedWriteTessellation *this)

{
  CallLogWrapper *this_00;
  float fVar1;
  bool bVar2;
  GLuint GVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  float *pfVar6;
  ulong uVar7;
  int h;
  vec3 *expected;
  long lVar8;
  uvec4 zero;
  anon_struct_32_3_caea0a8d data [6];
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  float local_c0 [36];
  
  bVar2 = ShaderStorageBufferObjectBase::SupportedInTES
                    (&this->super_ShaderStorageBufferObjectBase,1);
  lVar8 = 0x10;
  if (bVar2) {
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,
               "\nlayout(location = 0) in vec4 g_in_position;\nvoid main() {\n  gl_Position = g_in_position;\n}"
               ,"");
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,0x1aee929);
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,
               "\nlayout(quads) in;\nstruct VertexData {\n  int valid;\n  vec4 position;\n};\nlayout(std430, binding = 2) buffer VertexBuffer {\n  VertexData g_vertex_buffer[];\n};\nlayout(binding = 2, offset = 0) uniform atomic_uint g_vertex_counter;\nvoid main() {\n  const uint idx = atomicCounterIncrement(g_vertex_counter);\n  vec4 p0 = mix(gl_in[0].gl_Position, gl_in[1].gl_Position, gl_TessCoord.x);\n  vec4 p1 = mix(gl_in[3].gl_Position, gl_in[2].gl_Position, gl_TessCoord.x);\n  vec4 p = mix(p0, p1, gl_TessCoord.y);\n  g_vertex_buffer[idx].position = p;\n  g_vertex_buffer[idx].valid = 1;\n  gl_Position = g_vertex_buffer[idx].position;\n}"
               ,"");
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,0x1aee929);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,
               "\nlayout(location = 0) out vec4 g_fs_out;\nvoid main() {\n  g_fs_out = vec4(0, 1, 0, 1);\n}"
               ,"");
    GVar3 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,&local_f8,&local_178,&local_158,
                       &local_118,&local_138);
    this->m_program = GVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
    bVar2 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    lVar8 = -1;
    if (bVar2) {
      local_f8.field_2._M_allocated_capacity = 0x3f8000003f800000;
      local_f8.field_2._8_8_ = 0x3f800000bf800000;
      local_f8._M_dataplus._M_p = (pointer)0xbf800000bf800000;
      local_f8._M_string_length = 0xbf8000003f800000;
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_vertex_buffer);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vertex_buffer);
      glu::CallLogWrapper::glBufferData(this_00,0x8892,0x20,&local_f8,0x88e4);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_counter_buffer);
      glu::CallLogWrapper::glBindBufferBase(this_00,0x92c0,2,this->m_counter_buffer);
      glu::CallLogWrapper::glBufferData(this_00,0x92c0,4,(void *)0x0,0x88e8);
      local_178._M_dataplus._M_p = (pointer)0x0;
      local_178._M_string_length = 0;
      glu::CallLogWrapper::glBufferSubData(this_00,0x92c0,0,4,&local_178);
      lVar8 = 0x10;
      do {
        *(undefined8 *)((long)&local_f8._M_dataplus._M_p + lVar8) = 0;
        *(undefined8 *)((long)&local_f8._M_string_length + lVar8) = 0;
        lVar8 = lVar8 + 0x20;
      } while (lVar8 != 0xd0);
      memset(&local_f8,0,0xc0);
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_storage_buffer);
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,2,this->m_storage_buffer);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0xc0,&local_f8,0x88e8);
      glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vertex_array);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vertex_buffer);
      h = 0;
      expected = (vec3 *)0x0;
      glu::CallLogWrapper::glVertexAttribPointer(this_00,0,2,0x1406,'\0',0,(void *)0x0);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
      glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
      glu::CallLogWrapper::glBindVertexArray(this_00,0);
      glu::CallLogWrapper::glClear(this_00,0x4000);
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
      glu::CallLogWrapper::glPatchParameteri(this_00,0x8e72,4);
      glu::CallLogWrapper::glDrawArrays(this_00,0xe,0,4);
      iVar4 = (*((this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                m_context)->m_renderCtx->_vptr_RenderContext[4])();
      iVar4 = *(int *)CONCAT44(extraout_var,iVar4);
      iVar5 = (*((this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                m_context)->m_renderCtx->_vptr_RenderContext[4])();
      local_158._M_dataplus._M_p = (pointer)0x3f80000000000000;
      local_158._M_string_length._0_4_ = 0;
      bVar2 = ShaderStorageBufferObjectBase::ValidateReadBuffer
                        (&this->super_ShaderStorageBufferObjectBase,iVar4,
                         *(int *)(CONCAT44(extraout_var_00,iVar5) + 4),(int)&local_158,h,expected);
      lVar8 = -1;
      if (bVar2) {
        glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
        glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,0xc0,&local_f8);
        if (((((float)local_f8.field_2._8_4_ == 0.0) && (!NAN((float)local_f8.field_2._8_4_))) &&
            ((float)local_f8.field_2._12_4_ == 1.0)) && (!NAN((float)local_f8.field_2._12_4_))) {
          bVar2 = true;
          pfVar6 = local_c0 + 1;
          uVar7 = 0;
          while (((pfVar6[-0xf] == 1.4013e-45 && (bVar2 = uVar7 < 3, uVar7 != 3)) &&
                 ((pfVar6[-1] == 0.0 && (!NAN(pfVar6[-1])))))) {
            fVar1 = *pfVar6;
            pfVar6 = pfVar6 + 8;
            uVar7 = uVar7 + 1;
            if ((fVar1 != 1.0) || (NAN(fVar1))) break;
          }
          lVar8 = -(ulong)bVar2;
        }
      }
    }
  }
  return lVar8;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInTES(1))
			return NOT_SUPPORTED;

		const char* const glsl_vs = NL "layout(location = 0) in vec4 g_in_position;" NL "void main() {" NL
									   "  gl_Position = g_in_position;" NL "}";

		const char* const glsl_tes =
			NL "layout(quads) in;" NL "struct VertexData {" NL "  int valid;" NL "  vec4 position;" NL "};" NL
			   "layout(std430, binding = 2) buffer VertexBuffer {" NL "  VertexData g_vertex_buffer[];" NL "};" NL
			   "layout(binding = 2, offset = 0) uniform atomic_uint g_vertex_counter;" NL "void main() {" NL
			   "  const uint idx = atomicCounterIncrement(g_vertex_counter);" NL
			   "  vec4 p0 = mix(gl_in[0].gl_Position, gl_in[1].gl_Position, gl_TessCoord.x);" NL
			   "  vec4 p1 = mix(gl_in[3].gl_Position, gl_in[2].gl_Position, gl_TessCoord.x);" NL
			   "  vec4 p = mix(p0, p1, gl_TessCoord.y);" NL "  g_vertex_buffer[idx].position = p;" NL
			   "  g_vertex_buffer[idx].valid = 1;" NL "  gl_Position = g_vertex_buffer[idx].position;" NL "}";

		const char* const glsl_fs =
			NL "layout(location = 0) out vec4 g_fs_out;" NL "void main() {" NL "  g_fs_out = vec4(0, 1, 0, 1);" NL "}";

		m_program = CreateProgram(glsl_vs, "", glsl_tes, "", glsl_fs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		/* vertex buffer */
		{
			const float data[] = { -1, -1, 1, -1, 1, 1, -1, 1 };
			glGenBuffers(1, &m_vertex_buffer);
			glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
			glBufferData(GL_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
			glBindBuffer(GL_ARRAY_BUFFER, 0);
		}

		glGenBuffers(1, &m_counter_buffer);
		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 2, m_counter_buffer);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, 4, NULL, GL_DYNAMIC_DRAW);
		uvec4 zero;
		glBufferSubData(GL_ATOMIC_COUNTER_BUFFER, 0, 4, &zero);

		struct
		{
			int  valid;
			int  pad[3];
			vec4 position;
		} data[6];
		memset(data, 0, sizeof(data));
		glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 2, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_DRAW);

		glGenVertexArrays(1, &m_vertex_array);
		glBindVertexArray(m_vertex_array);
		glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
		glVertexAttribPointer(0, 2, GL_FLOAT, GL_FALSE, 0, 0);
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glEnableVertexAttribArray(0);
		glBindVertexArray(0);

		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(m_program);
		glBindVertexArray(m_vertex_array);
		glPatchParameteri(GL_PATCH_VERTICES, 4);
		glDrawArrays(GL_PATCHES, 0, 4);
		if (!ValidateReadBuffer(0, 0, getWindowWidth(), getWindowHeight(), vec3(0, 1, 0)))
		{
			return ERROR;
		}

		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), data);
		for (int i = 0; i < 4; ++i)
		{
			vec4 p = data[i].position;
			if (p[2] != 0.0f || p[3] != 1.0f)
				return ERROR;
			if (data[i].valid != 1)
				return ERROR;
		}

		return NO_ERROR;
	}